

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::setup(HEkkDualRow *this)

{
  int *piVar1;
  long *in_RDI;
  HighsInt numTot;
  undefined4 in_stack_fffffffffffffff0;
  
  setupSlice((HEkkDualRow *)
             CONCAT44(*(int *)(*in_RDI + 0x2198) + *(int *)(*in_RDI + 0x219c),
                      in_stack_fffffffffffffff0),(HighsInt)((ulong)in_RDI >> 0x20));
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x79ea3b);
  in_RDI[2] = (long)piVar1;
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x79ea4c);
  return;
}

Assistant:

void HEkkDualRow::setup() {
  // Setup common vectors
  const HighsInt numTot =
      ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
  setupSlice(numTot);
  workNumTotPermutation = ekk_instance_.info_.numTotPermutation_.data();

  // deleteFreelist() is being called in Phase 1 and Phase 2 since
  // it's in updatePivots(), but create_Freelist() is only called in
  // Phase 2. Hence freeList is not initialised when freeList.empty()
  // is used in deleteFreelist(), clear freeList now.
  freeList.clear();
}